

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

int cmcmd_cmake_ninja_depends(const_iterator argBeg,const_iterator argEnd)

{
  ValueHolder VVar1;
  ValueHolder VVar2;
  int iVar3;
  long *plVar4;
  ostream *poVar5;
  _Rb_tree_node_base *p_Var6;
  Value *pVVar7;
  const_iterator cVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  _Rb_tree_node_base *p_Var10;
  char *pcVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  unique_ptr<cmSourceInfo,_std::default_delete<cmSourceInfo>_> info;
  Value ddi;
  string arg_lang;
  string arg_ddi;
  string arg_pp;
  string arg_obj;
  string arg_dep;
  string arg_tdi;
  cmGeneratedFileStream ddif;
  ValueHolder local_400;
  ValueHolder local_3f8;
  long local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  Value local_2f0;
  Value local_2c8;
  Value local_2a0;
  ValueHolder local_278;
  long local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  byte abStack_258 [552];
  
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  local_330._M_string_length = 0;
  local_330.field_2._M_local_buf[0] = '\0';
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  local_390._M_string_length = 0;
  local_390.field_2._M_local_buf[0] = '\0';
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  local_350._M_string_length = 0;
  local_350.field_2._M_local_buf[0] = '\0';
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  local_370._M_string_length = 0;
  local_370.field_2._M_local_buf[0] = '\0';
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  local_3b0._M_string_length = 0;
  local_3b0.field_2._M_local_buf[0] = '\0';
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  local_3d0._M_string_length = 0;
  local_3d0.field_2._M_local_buf[0] = '\0';
  pcVar11 = "-E cmake_ninja_depends requires value for --tdi=";
  if (argBeg._M_current != argEnd._M_current) {
    do {
      pcVar11 = ((argBeg._M_current)->_M_dataplus)._M_p;
      iVar3 = strncmp(pcVar11,"--tdi=",6);
      if (iVar3 == 0) {
        std::__cxx11::string::substr((ulong)&local_278,(ulong)argBeg._M_current);
        this = &local_330;
      }
      else {
        iVar3 = strncmp(pcVar11,"--pp=",5);
        if (iVar3 == 0) {
          std::__cxx11::string::substr((ulong)&local_278,(ulong)argBeg._M_current);
          this = &local_390;
        }
        else {
          iVar3 = strncmp(pcVar11,"--dep=",6);
          if (iVar3 == 0) {
            std::__cxx11::string::substr((ulong)&local_278,(ulong)argBeg._M_current);
            this = &local_350;
          }
          else {
            iVar3 = strncmp(pcVar11,"--obj=",6);
            if (iVar3 == 0) {
              std::__cxx11::string::substr((ulong)&local_278,(ulong)argBeg._M_current);
              this = &local_370;
            }
            else {
              iVar3 = strncmp(pcVar11,"--ddi=",6);
              if (iVar3 == 0) {
                std::__cxx11::string::substr((ulong)&local_278,(ulong)argBeg._M_current);
                this = &local_3b0;
              }
              else {
                iVar3 = strncmp(pcVar11,"--lang=",7);
                if (iVar3 != 0) {
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_278,"-E cmake_ninja_depends unknown argument: ",
                                 argBeg._M_current);
                  cmSystemTools::Error((string *)&local_278);
                  if (local_278 != &local_268) {
                    operator_delete(local_278.string_,local_268._M_allocated_capacity + 1);
                  }
                  iVar3 = 1;
                  goto LAB_0023de50;
                }
                std::__cxx11::string::substr((ulong)&local_278,(ulong)argBeg._M_current);
                this = &local_3d0;
              }
            }
          }
        }
      }
      std::__cxx11::string::operator=((string *)this,(string *)&local_278.bool_);
      if (local_278 != &local_268) {
        operator_delete(local_278.string_,local_268._M_allocated_capacity + 1);
      }
      argBeg._M_current = argBeg._M_current + 1;
    } while (argBeg._M_current != argEnd._M_current);
    pcVar11 = "-E cmake_ninja_depends requires value for --tdi=";
    if (local_330._M_string_length != 0) {
      if (local_390._M_string_length == 0) {
        pcVar11 = "-E cmake_ninja_depends requires value for --pp=";
      }
      else if (local_350._M_string_length == 0) {
        pcVar11 = "-E cmake_ninja_depends requires value for --dep=";
      }
      else if (local_370._M_string_length == 0) {
        pcVar11 = "-E cmake_ninja_depends requires value for --obj=";
      }
      else if (local_3b0._M_string_length == 0) {
        pcVar11 = "-E cmake_ninja_depends requires value for --ddi=";
      }
      else {
        if (local_3d0._M_string_length != 0) {
          local_400.int_ = 0;
          iVar3 = std::__cxx11::string::compare((char *)&local_3d0);
          if (iVar3 == 0) {
            cmcmd_cmake_ninja_depends_fortran((string *)&local_278,&local_330);
            VVar2 = local_278;
            VVar1 = local_400;
            local_278.int_ = 0;
            local_400.int_ = VVar2.int_;
            if ((VVar1 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0) &&
               (std::default_delete<cmSourceInfo>::operator()
                          ((default_delete<cmSourceInfo> *)&local_400.bool_,
                           (cmSourceInfo *)VVar1.map_),
               local_278 !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0)) {
              std::default_delete<cmSourceInfo>::operator()
                        ((default_delete<cmSourceInfo> *)&local_278.bool_,
                         (cmSourceInfo *)local_278.map_);
            }
            if (local_400 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) goto LAB_0023e325;
            cmGeneratedFileStream::cmGeneratedFileStream
                      ((cmGeneratedFileStream *)&local_278,&local_350,false,None);
            cmsys::SystemTools::ConvertToUnixOutputPath((string *)&local_3f8,&local_390);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&local_278,local_3f8.string_,local_3f0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
            if (local_3f8 != &local_3e8) {
              operator_delete(local_3f8.string_,local_3e8._M_allocated_capacity + 1);
            }
            p_Var6 = *(_Rb_tree_node_base **)(local_400.int_ + 0x78);
            p_Var10 = (_Rb_tree_node_base *)(local_400.int_ + 0x68);
            if (p_Var6 != p_Var10) {
              do {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278," \\\n ",4)
                ;
                cmsys::SystemTools::ConvertToUnixOutputPath
                          ((string *)&local_3f8,(string *)(p_Var6 + 1));
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_278,local_3f8.string_,local_3f0);
                if (local_3f8 != &local_3e8) {
                  operator_delete(local_3f8.string_,local_3e8._M_allocated_capacity + 1);
                }
                p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
              } while (p_Var6 != p_Var10);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"\n",1);
            cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&local_278);
            Json::Value::Value((Value *)&local_3f8,objectValue);
            Json::Value::Value(&local_2a0,&local_370);
            pVVar7 = Json::Value::operator[]((Value *)&local_3f8,"object");
            Json::Value::operator=(pVVar7,&local_2a0);
            Json::Value::~Value(&local_2a0);
            Json::Value::Value(&local_2c8,arrayValue);
            pVVar7 = Json::Value::operator[]((Value *)&local_3f8,"provides");
            pVVar7 = Json::Value::operator=(pVVar7,&local_2c8);
            Json::Value::~Value(&local_2c8);
            p_Var6 = *(_Rb_tree_node_base **)((long)&(local_400.map_)->_M_t + 0x18);
            paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)&(local_400.map_)->_M_t;
            if (p_Var6 != (_Rb_tree_node_base *)(paVar9->_M_local_buf + 8)) {
              do {
                Json::Value::Value((Value *)&local_278,(string *)(p_Var6 + 1));
                Json::Value::append(pVVar7,(Value *)&local_278);
                Json::Value::~Value((Value *)&local_278);
                p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
              } while (p_Var6 != (_Rb_tree_node_base *)(paVar9->_M_local_buf + 8));
            }
            Json::Value::Value(&local_2f0,arrayValue);
            pVVar7 = Json::Value::operator[]((Value *)&local_3f8,"requires");
            pVVar7 = Json::Value::operator=(pVVar7,&local_2f0);
            Json::Value::~Value(&local_2f0);
            p_Var6 = *(_Rb_tree_node_base **)(local_400.int_ + 0x48);
            p_Var10 = (_Rb_tree_node_base *)(local_400.int_ + 0x38);
            if (p_Var6 != p_Var10) {
              do {
                VVar1 = local_400;
                cVar8 = std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_400.map_,(key_type *)(p_Var6 + 1));
                if (cVar8._M_node ==
                    (_Base_ptr)
                    (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&(VVar1.map_)->_M_t)->_M_local_buf + 8)) {
                  Json::Value::Value((Value *)&local_278,(string *)(p_Var6 + 1));
                  Json::Value::append(pVVar7,(Value *)&local_278);
                  Json::Value::~Value((Value *)&local_278);
                }
                p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
              } while (p_Var6 != p_Var10);
            }
            cmGeneratedFileStream::cmGeneratedFileStream
                      ((cmGeneratedFileStream *)&local_278,&local_3b0,false,None);
            Json::operator<<((ostream *)&local_278,(Value *)&local_3f8);
            if ((abStack_258[*(long *)(local_278.int_ + -0x18)] & 5) == 0) {
              iVar3 = 0;
            }
            else {
              std::operator+(&local_310,"-E cmake_ninja_depends failed to write ",&local_3b0);
              cmSystemTools::Error(&local_310);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_310._M_dataplus._M_p != &local_310.field_2) {
                operator_delete(local_310._M_dataplus._M_p,
                                local_310.field_2._M_allocated_capacity + 1);
              }
              iVar3 = 1;
            }
            cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&local_278);
            Json::Value::~Value((Value *)&local_3f8);
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_3f8,"-E cmake_ninja_depends does not understand the ",&local_3d0);
            plVar4 = (long *)std::__cxx11::string::append((char *)&local_3f8.int_);
            paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 == paVar9) {
              local_268._M_allocated_capacity = paVar9->_M_allocated_capacity;
              local_268._8_8_ = plVar4[3];
              local_278.string_ = (char *)&local_268;
            }
            else {
              local_268._M_allocated_capacity = paVar9->_M_allocated_capacity;
              local_278.string_ = ((char *)*plVar4).string_;
            }
            local_270 = plVar4[1];
            *plVar4 = (long)paVar9;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            cmSystemTools::Error((string *)&local_278);
            if (local_278 != &local_268) {
              operator_delete(local_278.string_,local_268._M_allocated_capacity + 1);
            }
            if (local_3f8 != &local_3e8) {
              operator_delete(local_3f8.string_,local_3e8._M_allocated_capacity + 1);
            }
LAB_0023e325:
            iVar3 = 1;
          }
          if (local_400 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            std::default_delete<cmSourceInfo>::operator()
                      ((default_delete<cmSourceInfo> *)&local_400.bool_,
                       (cmSourceInfo *)local_400.map_);
          }
          goto LAB_0023de50;
        }
        pcVar11 = "-E cmake_ninja_depends requires value for --lang=";
      }
    }
  }
  iVar3 = 1;
  cmSystemTools::Error(pcVar11,(char *)0x0,(char *)0x0,(char *)0x0);
LAB_0023de50:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,
                    CONCAT71(local_3d0.field_2._M_allocated_capacity._1_7_,
                             local_3d0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,
                    CONCAT71(local_3b0.field_2._M_allocated_capacity._1_7_,
                             local_3b0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,
                    CONCAT71(local_370.field_2._M_allocated_capacity._1_7_,
                             local_370.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,
                    CONCAT71(local_350.field_2._M_allocated_capacity._1_7_,
                             local_350.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,
                    CONCAT71(local_390.field_2._M_allocated_capacity._1_7_,
                             local_390.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,
                    CONCAT71(local_330.field_2._M_allocated_capacity._1_7_,
                             local_330.field_2._M_local_buf[0]) + 1);
  }
  return iVar3;
}

Assistant:

int cmcmd_cmake_ninja_depends(std::vector<std::string>::const_iterator argBeg,
                              std::vector<std::string>::const_iterator argEnd)
{
  std::string arg_tdi;
  std::string arg_pp;
  std::string arg_dep;
  std::string arg_obj;
  std::string arg_ddi;
  std::string arg_lang;
  for (std::string const& arg : cmMakeRange(argBeg, argEnd)) {
    if (cmHasLiteralPrefix(arg, "--tdi=")) {
      arg_tdi = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--pp=")) {
      arg_pp = arg.substr(5);
    } else if (cmHasLiteralPrefix(arg, "--dep=")) {
      arg_dep = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--obj=")) {
      arg_obj = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--ddi=")) {
      arg_ddi = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--lang=")) {
      arg_lang = arg.substr(7);
    } else {
      cmSystemTools::Error("-E cmake_ninja_depends unknown argument: " + arg);
      return 1;
    }
  }
  if (arg_tdi.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --tdi=");
    return 1;
  }
  if (arg_pp.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --pp=");
    return 1;
  }
  if (arg_dep.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --dep=");
    return 1;
  }
  if (arg_obj.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --obj=");
    return 1;
  }
  if (arg_ddi.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --ddi=");
    return 1;
  }
  if (arg_lang.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --lang=");
    return 1;
  }

  std::unique_ptr<cmSourceInfo> info;
  if (arg_lang == "Fortran") {
    info = cmcmd_cmake_ninja_depends_fortran(arg_tdi, arg_pp);
  } else {
    cmSystemTools::Error("-E cmake_ninja_depends does not understand the " +
                         arg_lang + " language");
    return 1;
  }

  if (!info) {
    // The error message is already expected to have been output.
    return 1;
  }

  {
    cmGeneratedFileStream depfile(arg_dep);
    depfile << cmSystemTools::ConvertToUnixOutputPath(arg_pp) << ":";
    for (std::string const& include : info->Includes) {
      depfile << " \\\n " << cmSystemTools::ConvertToUnixOutputPath(include);
    }
    depfile << "\n";
  }

  Json::Value ddi(Json::objectValue);
  ddi["object"] = arg_obj;

  Json::Value& ddi_provides = ddi["provides"] = Json::arrayValue;
  for (std::string const& provide : info->Provides) {
    ddi_provides.append(provide);
  }
  Json::Value& ddi_requires = ddi["requires"] = Json::arrayValue;
  for (std::string const& r : info->Requires) {
    // Require modules not provided in the same source.
    if (!info->Provides.count(r)) {
      ddi_requires.append(r);
    }
  }

  cmGeneratedFileStream ddif(arg_ddi);
  ddif << ddi;
  if (!ddif) {
    cmSystemTools::Error("-E cmake_ninja_depends failed to write " + arg_ddi);
    return 1;
  }
  return 0;
}